

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

string * __thiscall kratos::Var::to_string_abi_cxx11_(string *__return_storage_ptr__,Var *this)

{
  Var *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->name);
  return __return_storage_ptr__;
}

Assistant:

std::string Var::to_string() const { return name; }